

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O0

void __thiscall
dense_parameters::set_default<random_weights_wrapper<dense_parameters>>(dense_parameters *this)

{
  bool bVar1;
  float *w;
  int __c;
  dense_iterator<float> *rhs;
  dense_parameters *in_RDI;
  size_t i;
  iterator iter;
  uint64_t in_stack_ffffffffffffffa8;
  dense_parameters *in_stack_ffffffffffffffc0;
  dense_iterator<float> local_20;
  
  begin(in_stack_ffffffffffffffc0);
  while( true ) {
    end(in_stack_ffffffffffffffc0);
    rhs = (dense_iterator<float> *)&stack0xffffffffffffffc0;
    bVar1 = dense_iterator<float>::operator!=(&local_20,rhs);
    if (!bVar1) break;
    w = dense_iterator<float>::operator*(&local_20);
    dense_iterator<float>::index(&local_20,(char *)rhs,__c);
    random_weights_wrapper<dense_parameters>::func(w,in_stack_ffffffffffffffa8);
    dense_iterator<float>::operator++(&local_20);
    stride(in_RDI);
  }
  return;
}

Assistant:

void set_default()
  {
    iterator iter = begin();
    for (size_t i = 0; iter != end(); ++iter, i += stride()) T::func(*iter, iter.index());
  }